

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O1

PrimInfoMB * __thiscall
embree::sse2::BVHNBuilderMBlurSAHGrid<4>::createPrimRefArrayMSMBlurGrid
          (PrimInfoMB *__return_storage_ptr__,BVHNBuilderMBlurSAHGrid<4> *this,Scene *scene,
          mvector<PrimRefMB> *prims,BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  Geometry *pGVar5;
  SubGridBuildData *ptr;
  PrimRefMB *ptr_00;
  MemoryMonitorInterface *pMVar6;
  unsigned_long uVar7;
  size_t sVar8;
  size_t sVar9;
  undefined8 uVar10;
  BBox1f BVar11;
  char cVar12;
  int iVar13;
  ulong uVar14;
  BBox1f BVar15;
  SubGridBuildData *pSVar16;
  PrimRefMB *pPVar17;
  runtime_error *prVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  long lVar22;
  ulong uVar23;
  ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pPVar24;
  float *pfVar25;
  BBox1f BVar26;
  size_t sVar27;
  ulong uVar28;
  ulong uVar29;
  mvector<PrimRefMB> *pmVar30;
  ulong uVar31;
  bool bVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar41;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar42;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar43;
  float fVar44;
  float fVar45;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar46;
  unsigned_long uVar47;
  unsigned_long uVar48;
  float fVar49;
  BBox1f BVar50;
  size_t taskCount_1;
  Iterator<embree::GridMesh,_true> iter;
  size_t taskCount;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  anon_class_1_0_00000001 local_4dea;
  auto_partitioner local_4de9;
  mvector<PrimRefMB> *local_4de8;
  BBox1f local_4de0;
  BBox1f local_4dd8;
  Scene *local_4dd0;
  bool local_4dc8;
  BBox1f local_4dc0;
  BBox1f local_4db8;
  anon_class_16_2_341d598e_conflict2 local_4db0;
  anon_class_16_2_341d598e_conflict2 local_4da0;
  mvector<PrimRefMB> *local_4d90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4d88;
  undefined8 local_4d78;
  undefined8 uStack_4d70;
  undefined8 local_4d68;
  undefined8 uStack_4d60;
  undefined8 local_4d58;
  undefined8 uStack_4d50;
  undefined8 local_4d48;
  undefined8 uStack_4d40;
  undefined8 local_4d38;
  undefined8 uStack_4d30;
  unsigned_long local_4d28;
  unsigned_long uStack_4d20;
  size_t local_4d18;
  size_t sStack_4d10;
  float local_4d08;
  float fStack_4d04;
  float fStack_4d00;
  float fStack_4cfc;
  anon_class_48_6_afa08d2e_conflict2 local_4cf8;
  task_group_context local_4cc8;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> local_4c48;
  
  local_4c48.super_ParallelForForState.taskCount = 0;
  local_4dc8 = false;
  sVar27 = (scene->geometries).size_active;
  if (sVar27 == 0) {
    uVar29 = 0;
  }
  else {
    uVar29 = 0;
    sVar21 = 0;
    do {
      pGVar5 = (scene->geometries).items[sVar21].ptr;
      if ((((pGVar5 == (Geometry *)0x0) || (((pGVar5->field_8).field_0x2 & 0x20) == 0)) ||
          (*(char *)&pGVar5->field_8 != '\x16')) || (pGVar5->numTimeSteps == 1)) {
        uVar19 = 0;
      }
      else {
        uVar19 = (ulong)pGVar5->numPrimitives;
      }
      uVar29 = uVar29 + uVar19;
      sVar21 = sVar21 + 1;
    } while (sVar27 != sVar21);
  }
  local_4de8 = prims;
  local_4de0 = t0t1;
  local_4dd0 = scene;
  local_4c48.super_ParallelForForState.N = uVar29;
  iVar13 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar19 = uVar29 + 0x3ff >> 10;
  if ((ulong)(long)iVar13 < uVar19) {
    uVar19 = (long)iVar13;
  }
  uVar23 = 0x40;
  if (uVar19 < 0x40) {
    uVar23 = uVar19;
  }
  local_4c48.super_ParallelForForState.taskCount = uVar23 + (uVar23 == 0);
  local_4c48.super_ParallelForForState.i0[0] = 0;
  local_4c48.super_ParallelForForState.j0[0] = 0;
  if (1 < uVar19) {
    uVar23 = 0;
    uVar19 = uVar29 / local_4c48.super_ParallelForForState.taskCount;
    BVar26.lower = 1.4013e-45;
    BVar26.upper = 0.0;
    sVar27 = 0;
    do {
      pGVar5 = (local_4dd0->geometries).items[sVar27].ptr;
      if ((((pGVar5 == (Geometry *)0x0) ||
           (((local_4dc8 & 1U) == 0 && (((pGVar5->field_8).field_0x2 & 0x20) == 0)))) ||
          (*(char *)&pGVar5->field_8 != '\x16')) || (pGVar5->numTimeSteps == 1)) {
        uVar28 = 0;
      }
      else {
        uVar28 = (ulong)pGVar5->numPrimitives;
      }
      if (uVar28 == 0) {
        lVar22 = 0;
      }
      else {
        uVar20 = ((long)BVar26 + 1U) * uVar29;
        lVar22 = 0;
        uVar31 = 0;
        do {
          uVar14 = uVar19;
          uVar19 = uVar14;
          if ((uVar28 + uVar23 + lVar22 < uVar14) ||
             (local_4c48.super_ParallelForForState.taskCount <= (ulong)BVar26)) break;
          local_4c48.super_ParallelForForState.i0[(long)BVar26] = sVar27;
          uVar31 = uVar31 + (uVar14 - uVar23);
          local_4c48.super_ParallelForForState.j0[(long)BVar26] = uVar31;
          BVar26 = (BBox1f)((long)BVar26 + 1);
          uVar19 = uVar20 / local_4c48.super_ParallelForForState.taskCount;
          lVar22 = -uVar31;
          uVar20 = uVar20 + uVar29;
          uVar23 = uVar14;
        } while (uVar31 < uVar28);
      }
      uVar23 = uVar23 + uVar28 + lVar22;
      sVar27 = sVar27 + 1;
    } while ((ulong)BVar26 < local_4c48.super_ParallelForForState.taskCount);
  }
  sVar27 = local_4c48.super_ParallelForForState.taskCount;
  local_4cf8.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d88;
  local_4d88._0_8_ = 0x7f8000007f800000;
  local_4d88._8_8_ = 0x7f8000007f800000;
  local_4d78 = 0xff800000ff800000;
  uStack_4d70 = 0xff800000ff800000;
  local_4d68 = 0x7f8000007f800000;
  uStack_4d60 = 0x7f8000007f800000;
  local_4d58 = 0xff800000ff800000;
  uStack_4d50 = 0xff800000ff800000;
  local_4d48 = 0x7f8000007f800000;
  uStack_4d40 = 0x7f8000007f800000;
  local_4d38 = 0xff800000ff800000;
  uStack_4d30 = 0xff800000ff800000;
  local_4d28 = 0;
  uStack_4d20 = 0;
  local_4d18 = 0;
  sStack_4d10 = 0;
  local_4d08 = 0.0;
  fStack_4d04 = 1.0;
  fStack_4d00 = 1.0;
  fStack_4cfc = 0.0;
  local_4dc0 = (BBox1f)&local_4de0;
  local_4da0.func = (anon_class_8_1_89912a77 *)&local_4dc0;
  local_4dd8 = (BBox1f)&local_4dd0;
  local_4cf8.getSize = (anon_class_8_1_4d25ca37_conflict *)&local_4dd8;
  local_4cf8.func = &local_4da0;
  local_4cf8.taskCount = (size_t *)&local_4db8;
  local_4cf8.state = &local_4c48;
  local_4cf8.reduction = &local_4dea;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4db8 = (BBox1f)local_4c48.super_ParallelForForState.taskCount;
  local_4da0.array2 = (Iterator<embree::GridMesh,_true> *)local_4dd8;
  tbb::detail::r1::initialize(&local_4cc8);
  local_4db0.func = (anon_class_8_1_89912a77 *)&local_4cf8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,sVar27,1,(anon_class_8_1_898bcfc2_conflict10 *)&local_4db0,&local_4de9,&local_4cc8);
  cVar12 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  if (cVar12 != '\0') {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar18,"task cancelled");
    __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_4cc8);
  aVar33._8_8_ = local_4d88._8_8_;
  aVar33._0_8_ = local_4d88._0_8_;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar33;
  aVar34._8_8_ = uStack_4d70;
  aVar34._0_8_ = local_4d78;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar34;
  aVar36._8_8_ = uStack_4d60;
  aVar36._0_8_ = local_4d68;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar36;
  aVar38._8_8_ = uStack_4d50;
  aVar38._0_8_ = local_4d58;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar38;
  aVar40._8_8_ = uStack_4d40;
  aVar40._0_8_ = local_4d48;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar40;
  aVar42._8_8_ = uStack_4d30;
  aVar42._0_8_ = local_4d38;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar42;
  (__return_storage_ptr__->object_range)._begin = local_4d28;
  (__return_storage_ptr__->object_range)._end = uStack_4d20;
  BVar15.upper = fStack_4d04;
  BVar15.lower = local_4d08;
  BVar11.upper = fStack_4cfc;
  BVar11.lower = fStack_4d00;
  __return_storage_ptr__->max_time_range = BVar15;
  __return_storage_ptr__->time_range = BVar11;
  __return_storage_ptr__->num_time_segments = local_4d18;
  __return_storage_ptr__->max_num_time_segments = sStack_4d10;
  if (local_4db8 != (BBox1f)0x0) {
    sVar27 = __return_storage_ptr__->num_time_segments;
    pPVar24 = &local_4c48.prefix_state;
    BVar26 = __return_storage_ptr__->max_time_range;
    uVar47 = (__return_storage_ptr__->object_range)._begin;
    uVar48 = (__return_storage_ptr__->object_range)._end;
    sVar21 = __return_storage_ptr__->max_num_time_segments;
    BVar15 = local_4db8;
    fVar49 = (__return_storage_ptr__->time_range).upper;
    fVar44 = (__return_storage_ptr__->time_range).lower;
    do {
      uVar19 = pPVar24->counts[0].max_num_time_segments;
      uVar29._0_4_ = pPVar24->counts[0].max_time_range.lower;
      uVar29._4_4_ = pPVar24->counts[0].max_time_range.upper;
      fVar3 = pPVar24->counts[0].time_range.upper;
      pPVar24->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
      field_0 = aVar33;
      pPVar24->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
      field_0 = aVar34;
      pPVar24->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
      field_0 = aVar36;
      pPVar24->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
      field_0 = aVar38;
      pPVar24->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0 =
           aVar40;
      pPVar24->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0 =
           aVar42;
      aVar33.m128 = (__m128)minps(aVar33.m128,
                                  pPVar24->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  geomBounds.bounds0.lower.field_0);
      aVar34.m128 = (__m128)maxps(aVar34.m128,
                                  pPVar24->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  geomBounds.bounds0.upper.field_0);
      aVar36.m128 = (__m128)minps(aVar36.m128,
                                  pPVar24->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  geomBounds.bounds1.lower.field_0);
      aVar38.m128 = (__m128)maxps(aVar38.m128,
                                  pPVar24->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  geomBounds.bounds1.upper.field_0);
      aVar40.m128 = (__m128)minps(aVar40.m128,
                                  pPVar24->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  centBounds.lower.field_0);
      aVar42.m128 = (__m128)maxps(aVar42.m128,
                                  pPVar24->counts[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  centBounds.upper.field_0);
      fVar4 = pPVar24->counts[0].time_range.lower;
      fVar45 = fVar44;
      if (fVar4 <= fVar44) {
        fVar45 = fVar4;
      }
      sVar27 = sVar27 + pPVar24->counts[0].num_time_segments;
      uVar7 = (__return_storage_ptr__->object_range)._end;
      sVar8 = __return_storage_ptr__->num_time_segments;
      sVar9 = __return_storage_ptr__->max_num_time_segments;
      pPVar24->sums[0].object_range._begin = (__return_storage_ptr__->object_range)._begin;
      pPVar24->sums[0].object_range._end = uVar7;
      pPVar24->sums[0].num_time_segments = sVar8;
      pPVar24->sums[0].max_num_time_segments = sVar9;
      pPVar24->sums[0].max_time_range = BVar26;
      pPVar24->sums[0].time_range.lower = fVar44;
      pPVar24->sums[0].time_range.upper = fVar49;
      if (fVar3 <= fVar49) {
        fVar3 = fVar49;
      }
      uVar23 = CONCAT44((int)((uint)(sVar21 < uVar19) << 0x1f) >> 0x1f,
                        (int)((uint)(sVar21 < uVar19) << 0x1f) >> 0x1f);
      if (sVar21 <= uVar19) {
        sVar21 = uVar19;
      }
      BVar26 = (BBox1f)(~uVar23 & (ulong)BVar26 | uVar29 & uVar23);
      uVar47 = uVar47 + pPVar24->counts[0].object_range._begin;
      uVar48 = uVar48 + pPVar24->counts[0].object_range._end;
      (__return_storage_ptr__->object_range)._begin = uVar47;
      (__return_storage_ptr__->object_range)._end = uVar48;
      __return_storage_ptr__->num_time_segments = sVar27;
      __return_storage_ptr__->max_num_time_segments = sVar21;
      pPVar24 = (ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)
                (pPVar24->counts + 1);
      BVar15 = (BBox1f)((long)BVar15 - 1);
      fVar49 = fVar3;
      fVar44 = fVar45;
    } while (BVar15 != (BBox1f)0x0);
    __return_storage_ptr__->max_time_range = BVar26;
    (__return_storage_ptr__->time_range).lower = fVar45;
    (__return_storage_ptr__->time_range).upper = fVar3;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar33;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar34;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar36;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar38;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar40;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar42;
  uVar29 = (__return_storage_ptr__->object_range)._end -
           (__return_storage_ptr__->object_range)._begin;
  if (uVar29 != 0) {
    uVar19 = (this->sgrids).size_alloced;
    uVar23 = uVar19;
    if ((uVar19 < uVar29) && (uVar23 = uVar29, uVar19 != 0)) {
      while (uVar23 = uVar19, uVar23 < uVar29) {
        uVar19 = uVar23 * 2 + (ulong)(uVar23 * 2 == 0);
      }
    }
    if (uVar29 < (this->sgrids).size_active) {
      (this->sgrids).size_active = uVar29;
    }
    if ((this->sgrids).size_alloced == uVar23) {
      (this->sgrids).size_active = uVar29;
    }
    else {
      ptr = (this->sgrids).items;
      if (uVar23 != 0) {
        pMVar6 = (this->sgrids).alloc.device;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,uVar23 * 8,0);
      }
      uVar19 = uVar23 * 8;
      if (uVar19 < 0x1c00000) {
        pSVar16 = (SubGridBuildData *)alignedMalloc(uVar19,4);
      }
      else {
        pSVar16 = (SubGridBuildData *)os_malloc(uVar19,&(this->sgrids).alloc.hugepages);
      }
      (this->sgrids).items = pSVar16;
      if ((this->sgrids).size_active != 0) {
        uVar19 = 0;
        do {
          (this->sgrids).items[uVar19] = ptr[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar19 < (this->sgrids).size_active);
      }
      sVar27 = (this->sgrids).size_alloced;
      if (ptr != (SubGridBuildData *)0x0) {
        if (sVar27 * 8 < 0x1c00000) {
          alignedFree(ptr);
        }
        else {
          os_free(ptr,sVar27 * 8,(this->sgrids).alloc.hugepages);
        }
      }
      if (sVar27 != 0) {
        pMVar6 = (this->sgrids).alloc.device;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar27 * -8,1);
      }
      (this->sgrids).size_active = uVar29;
      (this->sgrids).size_alloced = uVar23;
    }
    pmVar30 = local_4de8;
    uVar19 = local_4de8->size_alloced;
    uVar23 = uVar19;
    if ((uVar19 < uVar29) && (uVar23 = uVar29, uVar28 = uVar19, uVar19 != 0)) {
      while (uVar23 = uVar28, uVar23 < uVar29) {
        uVar28 = uVar23 * 2 + (ulong)(uVar23 * 2 == 0);
      }
    }
    if (uVar29 < local_4de8->size_active) {
      local_4de8->size_active = uVar29;
    }
    if (uVar19 == uVar23) {
      local_4de8->size_active = uVar29;
    }
    else {
      ptr_00 = local_4de8->items;
      if (uVar23 != 0) {
        pMVar6 = (local_4de8->alloc).device;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,uVar23 * 0x50,0);
      }
      uVar19 = uVar23 * 0x50;
      if (uVar19 < 0x1c00000) {
        pPVar17 = (PrimRefMB *)alignedMalloc(uVar19,0x10);
      }
      else {
        pPVar17 = (PrimRefMB *)os_malloc(uVar19,&(pmVar30->alloc).hugepages);
      }
      pmVar30->items = pPVar17;
      if (pmVar30->size_active != 0) {
        lVar22 = 0x40;
        uVar19 = 0;
        do {
          pPVar17 = pmVar30->items;
          puVar1 = (undefined8 *)((long)ptr_00 + lVar22 + -0x40);
          uVar10 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar17 + lVar22 + -0x40);
          *puVar2 = *puVar1;
          puVar2[1] = uVar10;
          puVar1 = (undefined8 *)((long)ptr_00 + lVar22 + -0x30);
          uVar10 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar17 + lVar22 + -0x30);
          *puVar2 = *puVar1;
          puVar2[1] = uVar10;
          puVar1 = (undefined8 *)((long)ptr_00 + lVar22 + -0x20);
          uVar10 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar17 + lVar22 + -0x20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar10;
          puVar1 = (undefined8 *)((long)ptr_00 + lVar22 + -0x10);
          uVar10 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar17 + lVar22 + -0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar10;
          *(undefined8 *)((long)&(pPVar17->lbounds).bounds0.lower.field_0 + lVar22) =
               *(undefined8 *)((long)&(ptr_00->lbounds).bounds0.lower.field_0 + lVar22);
          uVar19 = uVar19 + 1;
          lVar22 = lVar22 + 0x50;
        } while (uVar19 < pmVar30->size_active);
      }
      sVar27 = pmVar30->size_alloced;
      if (ptr_00 != (PrimRefMB *)0x0) {
        if (sVar27 * 0x50 < 0x1c00000) {
          alignedFree(ptr_00);
        }
        else {
          os_free(ptr_00,sVar27 * 0x50,(local_4de8->alloc).hugepages);
        }
      }
      pmVar30 = local_4de8;
      if (sVar27 != 0) {
        pMVar6 = (local_4de8->alloc).device;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar27 * -0x50,1);
      }
      pmVar30->size_active = uVar29;
      pmVar30->size_alloced = uVar23;
    }
    sVar27 = local_4c48.super_ParallelForForState.taskCount;
    local_4d88._0_8_ = 0x7f8000007f800000;
    local_4d88._8_8_ = 0x7f8000007f800000;
    local_4d78 = 0xff800000ff800000;
    uStack_4d70 = 0xff800000ff800000;
    local_4d68 = 0x7f8000007f800000;
    uStack_4d60 = 0x7f8000007f800000;
    local_4d58 = 0xff800000ff800000;
    uStack_4d50 = 0xff800000ff800000;
    local_4d48 = 0x7f8000007f800000;
    uStack_4d40 = 0x7f8000007f800000;
    local_4d38 = 0xff800000ff800000;
    uStack_4d30 = 0xff800000ff800000;
    local_4d28 = 0;
    uStack_4d20 = 0;
    local_4d18 = 0;
    sStack_4d10 = 0;
    local_4d08 = 0.0;
    fStack_4d04 = 1.0;
    fStack_4d00 = 1.0;
    fStack_4cfc = 0.0;
    local_4da0.func = (anon_class_8_1_89912a77 *)&local_4de0;
    local_4dc0 = (BBox1f)&local_4dd0;
    local_4db0.func = (anon_class_8_1_89912a77 *)&local_4da0;
    local_4dd8.lower = (float)(undefined4)local_4c48.super_ParallelForForState.taskCount;
    local_4dd8.upper = (float)local_4c48.super_ParallelForForState.taskCount._4_4_;
    local_4cf8.state = &local_4c48;
    local_4cf8.taskCount = (size_t *)&local_4dd8;
    local_4cf8.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d88;
    local_4cf8.getSize = (anon_class_8_1_4d25ca37_conflict *)&local_4dc0;
    local_4cf8.reduction = &local_4dea;
    local_4cf8.func = &local_4db0;
    local_4cc8.my_version = proxy_support;
    local_4cc8.my_traits = (context_traits)0x4;
    local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_4cc8.my_name = CUSTOM_CTX;
    local_4db0.array2 = (Iterator<embree::GridMesh,_true> *)local_4dc0;
    local_4da0.array2 = (Iterator<embree::GridMesh,_true> *)this;
    local_4d90 = pmVar30;
    tbb::detail::r1::initialize(&local_4cc8);
    local_4db8 = (BBox1f)&local_4cf8;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,sVar27,1,(anon_class_8_1_898bcfc2_conflict10 *)&local_4db8,&local_4de9,&local_4cc8)
    ;
    cVar12 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
    if (cVar12 != '\0') {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar18,"task cancelled");
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_4cc8);
    aVar46._8_8_ = local_4d88._8_8_;
    aVar46._0_8_ = local_4d88._0_8_;
    aVar43._8_8_ = uStack_4d70;
    aVar43._0_8_ = local_4d78;
    aVar41._8_8_ = uStack_4d60;
    aVar41._0_8_ = local_4d68;
    aVar39._8_8_ = uStack_4d50;
    aVar39._0_8_ = local_4d58;
    aVar37._8_8_ = uStack_4d40;
    aVar37._0_8_ = local_4d48;
    aVar35._8_8_ = uStack_4d30;
    aVar35._0_8_ = local_4d38;
    BVar50.upper = fStack_4d04;
    BVar50.lower = local_4d08;
    if (local_4dd8 != (BBox1f)0x0) {
      pfVar25 = &local_4c48.prefix_state.sums[0].time_range.upper;
      fVar49 = fStack_4cfc;
      do {
        uVar19 = *(ulong *)(pfVar25 + -0x905);
        uVar29 = *(ulong *)(pfVar25 + -0x903);
        fStack_4cfc = pfVar25[-0x900];
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar25 + -0x23) = aVar46;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar25 + -0x1f) = aVar43;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar25 + -0x1b) = aVar41;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar25 + -0x17) = aVar39;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar25 + -0x13) = aVar37;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pfVar25 + -0xf) = aVar35;
        *(unsigned_long *)(pfVar25 + -0xb) = local_4d28;
        *(unsigned_long *)(pfVar25 + -9) = uStack_4d20;
        *(size_t *)(pfVar25 + -7) = local_4d18;
        *(size_t *)(pfVar25 + -5) = sStack_4d10;
        *(BBox1f *)(pfVar25 + -3) = BVar50;
        ((BBox1f *)(pfVar25 + -1))->lower = fStack_4d00;
        *pfVar25 = fVar49;
        aVar46.m128 = (__m128)minps(aVar46.m128,*(undefined1 (*) [16])(pfVar25 + -0x923));
        aVar43.m128 = (__m128)maxps(aVar43.m128,*(undefined1 (*) [16])(pfVar25 + -0x91f));
        aVar41.m128 = (__m128)minps(aVar41.m128,*(undefined1 (*) [16])(pfVar25 + -0x91b));
        aVar39.m128 = (__m128)maxps(aVar39.m128,*(undefined1 (*) [16])(pfVar25 + -0x917));
        aVar37.m128 = (__m128)minps(aVar37.m128,*(undefined1 (*) [16])(pfVar25 + -0x913));
        aVar35.m128 = (__m128)maxps(aVar35.m128,*(undefined1 (*) [16])(pfVar25 + -0x90f));
        if (pfVar25[-0x901] <= fStack_4d00) {
          fStack_4d00 = pfVar25[-0x901];
        }
        local_4d28 = local_4d28 + *(long *)(pfVar25 + -0x90b);
        uStack_4d20 = uStack_4d20 + *(long *)(pfVar25 + -0x909);
        if (fStack_4cfc <= fVar49) {
          fStack_4cfc = fVar49;
        }
        local_4d18 = local_4d18 + *(long *)(pfVar25 + -0x907);
        bVar32 = sStack_4d10 < uVar19;
        if (sStack_4d10 <= uVar19) {
          sStack_4d10 = uVar19;
        }
        uVar19 = CONCAT44((int)((uint)bVar32 << 0x1f) >> 0x1f,(int)((uint)bVar32 << 0x1f) >> 0x1f);
        BVar50 = (BBox1f)(~uVar19 & (ulong)BVar50 | uVar29 & uVar19);
        pfVar25 = pfVar25 + 0x24;
        local_4dd8 = (BBox1f)((long)local_4dd8 - 1);
        fVar49 = fStack_4cfc;
      } while (local_4dd8 != (BBox1f)0x0);
    }
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    lower.field_0 = aVar46;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    upper.field_0 = aVar43;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    lower.field_0 = aVar41;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    upper.field_0 = aVar39;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
    field_0 = aVar37;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
    field_0 = aVar35;
    (__return_storage_ptr__->object_range)._begin = local_4d28;
    (__return_storage_ptr__->object_range)._end = uStack_4d20;
    __return_storage_ptr__->num_time_segments = local_4d18;
    __return_storage_ptr__->max_num_time_segments = sStack_4d10;
    __return_storage_ptr__->max_time_range = BVar50;
    (__return_storage_ptr__->time_range).lower = fStack_4d00;
    (__return_storage_ptr__->time_range).upper = fStack_4cfc;
    __return_storage_ptr__->time_range = local_4de0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlurGrid(Scene* scene, mvector<PrimRefMB>& prims, BuildProgressMonitor& progressMonitor, BBox1f t0t1 = BBox1f(0.0f,1.0f))
      {
        /* first run to get #primitives */
        ParallelForForPrefixSumState<PrimInfoMB> pstate;
        Scene::Iterator<GridMesh,true> iter(scene);

        pstate.init(iter,size_t(1024));
        /* iterate over all meshes in the scene */
        PrimInfoMB pinfoMB = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](GridMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfoMB {
            
            PrimInfoMB pinfoMB(empty);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              if (!mesh->valid(j, mesh->timeSegmentRange(t0t1))) continue;
              LBBox3fa bounds(empty);
              PrimInfoMB gridMB(0,mesh->getNumSubGrids(j));
              pinfoMB.merge(gridMB);
            }
            return pinfoMB;
          }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        
        size_t numPrimitives = pinfoMB.size();
        if (numPrimitives == 0) return pinfoMB;

        /* resize arrays */
        sgrids.resize(numPrimitives); 
        prims.resize(numPrimitives); 
        /* second run to fill primrefs and SubGridBuildData arrays */
        pinfoMB = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](GridMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
            
            k = base.size();
            size_t p_index = k;
            PrimInfoMB pinfoMB(empty);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              if (!mesh->valid(j, mesh->timeSegmentRange(t0t1))) continue;
              const GridMesh::Grid &g = mesh->grid(j);
              
              for (unsigned int y=0; y<g.resY-1u; y+=2)
                for (unsigned int x=0; x<g.resX-1u; x+=2)
                {
                  const PrimRefMB prim(mesh->linearBounds(g,x,y,t0t1),mesh->numTimeSegments(),mesh->time_range,mesh->numTimeSegments(),unsigned(geomID),unsigned(p_index));
                  pinfoMB.add_primref(prim);
                  sgrids[p_index] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
                  prims[p_index++] = prim;                
                }
            }
            return pinfoMB;
          }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        
        assert(pinfoMB.size() == numPrimitives);
        pinfoMB.time_range = t0t1;
        return pinfoMB;
      }